

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O0

void __thiscall QColumnViewPrivate::disconnectView(QColumnViewPrivate *this,QAbstractItemView *view)

{
  long lVar1;
  bool bVar2;
  vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_> *in_RDI;
  long in_FS_OFFSET;
  piter it_00;
  Connection *connection;
  vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_> *__range1;
  iterator __end1;
  iterator __begin1;
  iterator it;
  __normal_iterator<QMetaObject::Connection_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
  *in_stack_ffffffffffffff78;
  iterator *in_stack_ffffffffffffff88;
  QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
  *in_stack_ffffffffffffff98;
  const_iterator local_50;
  Connection *local_40;
  __normal_iterator<QMetaObject::Connection_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
  local_38;
  piter local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  it_00 = (piter)QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
                 ::find((QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
                         *)in_RDI,(QAbstractItemView **)in_stack_ffffffffffffff78);
  local_30 = (piter)QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
                    ::end((QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
                           *)in_stack_ffffffffffffff88);
  bVar2 = QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
          ::iterator::operator==(in_stack_ffffffffffffff88,(iterator *)in_RDI);
  if (!bVar2) {
    QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
    ::iterator::value((iterator *)0x8619e1);
    local_38._M_current = (Connection *)&DAT_aaaaaaaaaaaaaaaa;
    local_38._M_current =
         (Connection *)
         std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>::begin
                   (in_RDI);
    local_40 = (Connection *)&DAT_aaaaaaaaaaaaaaaa;
    local_40 = (Connection *)
               std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>::end
                         (in_RDI);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<QMetaObject::Connection_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
                               *)in_RDI,in_stack_ffffffffffffff78), bVar2) {
      in_stack_ffffffffffffff98 =
           (QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
            *)__gnu_cxx::
              __normal_iterator<QMetaObject::Connection_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
              ::operator*(&local_38);
      QObject::disconnect((Connection *)in_stack_ffffffffffffff98);
      __gnu_cxx::
      __normal_iterator<QMetaObject::Connection_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
      ::operator++(&local_38);
    }
    QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
    ::const_iterator::const_iterator(&local_50,(iterator *)&stack0xffffffffffffffe0);
    QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
    ::erase(in_stack_ffffffffffffff98,(const_iterator)it_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColumnViewPrivate::disconnectView(QAbstractItemView *view)
{
    const auto it = viewConnections.find(view);
    if (it == viewConnections.end())
        return;
    for (const QMetaObject::Connection &connection : it.value())
        QObject::disconnect(connection);
    viewConnections.erase(it);
}